

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_backtrace.cpp
# Opt level: O0

int foo(void)

{
  undefined8 uVar1;
  undefined3 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  runtime_error *in_stack_ffffffffffffffd0;
  allocator local_21;
  string local_20 [32];
  
  uVar2 = CONCAT13(1,in_stack_ffffffffffffffc8);
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"My Error",&local_21);
  booster::runtime_error::runtime_error
            (in_stack_ffffffffffffffd0,(string *)CONCAT44(in_stack_ffffffffffffffcc,uVar2));
  __cxa_throw(uVar1,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

int foo()
{
	throw booster::runtime_error("My Error");
	return 10;
}